

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O2

void __thiscall foxxll::request::check_alignment(request *this)

{
  Logger LStack_188;
  
  if ((this->offset_ & 0xfff) != 0) {
    tlx::Logger::Logger(&LStack_188);
    std::operator<<((ostream *)&LStack_188,"Offset is not aligned: modulo ");
    tlx::LoggerFormatter<unsigned_long,_void>::print((ostream *)&LStack_188,&BlockAlignment);
    std::operator<<((ostream *)&LStack_188," = ");
    std::ostream::_M_insert<unsigned_long>((ulong)&LStack_188);
    tlx::Logger::~Logger(&LStack_188);
  }
  if ((this->bytes_ & 0xfff) != 0) {
    tlx::Logger::Logger(&LStack_188);
    std::operator<<((ostream *)&LStack_188,"Size is not a multiple of ");
    tlx::LoggerFormatter<unsigned_long,_void>::print((ostream *)&LStack_188,&BlockAlignment);
    std::operator<<((ostream *)&LStack_188,", = ");
    std::ostream::_M_insert<unsigned_long>((ulong)&LStack_188);
    tlx::Logger::~Logger(&LStack_188);
  }
  if (((ulong)this->buffer_ & 0xfff) != 0) {
    tlx::Logger::Logger(&LStack_188);
    std::operator<<((ostream *)&LStack_188,"Buffer is not aligned: modulo ");
    tlx::LoggerFormatter<unsigned_long,_void>::print((ostream *)&LStack_188,&BlockAlignment);
    std::operator<<((ostream *)&LStack_188," = ");
    std::ostream::_M_insert<unsigned_long>((ulong)&LStack_188);
    std::operator<<((ostream *)&LStack_188," (");
    tlx::LoggerFormatter<void_*,_void>::print((ostream *)&LStack_188,&this->buffer_);
    std::operator<<((ostream *)&LStack_188,")");
    tlx::Logger::~Logger(&LStack_188);
  }
  return;
}

Assistant:

void request::check_alignment() const
{
    if (offset_ % BlockAlignment != 0)
        TLX_LOG1 << "Offset is not aligned: modulo " <<
            BlockAlignment << " = " << offset_ % BlockAlignment;

    if (bytes_ % BlockAlignment != 0)
        TLX_LOG1 << "Size is not a multiple of " <<
            BlockAlignment << ", = " << bytes_ % BlockAlignment;

    if (size_t(buffer_) % BlockAlignment != 0)
        TLX_LOG1 << "Buffer is not aligned: modulo " <<
            BlockAlignment << " = " << size_t(buffer_) % BlockAlignment <<
            " (" << buffer_ << ")";
}